

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

UINT8 __thiscall VGMPlayer::SetDeviceOptions(VGMPlayer *this,UINT32 id,PLR_DEV_OPTS *devOpts)

{
  ulong uVar1;
  pointer pCVar2;
  UINT8 UVar3;
  size_t sVar4;
  VGMPlayer *this_00;
  
  sVar4 = DeviceID2OptionID(this,id);
  if (sVar4 == 0xffffffffffffffff) {
    UVar3 = 0x80;
  }
  else {
    memcpy(this->_devOpts + sVar4,devOpts,0xa0);
    uVar1 = this->_optDevMap[sVar4];
    pCVar2 = (this->_devices).
             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar1 < (ulong)(((long)(this->_devices).
                               super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) / 0xf0)) {
      this_00 = this;
      RefreshDevOptions(this,pCVar2 + uVar1,this->_devOpts + sVar4);
      RefreshMuting(this_00,(this->_devices).
                            super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar1,
                    &this->_devOpts[sVar4].muteOpts);
      RefreshPanning(this_00,(this->_devices).
                             super__Vector_base<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar1,
                     &this->_devOpts[sVar4].panOpts);
    }
    UVar3 = '\0';
  }
  return UVar3;
}

Assistant:

UINT8 VGMPlayer::SetDeviceOptions(UINT32 id, const PLR_DEV_OPTS& devOpts)
{
	size_t optID = DeviceID2OptionID(id);
	if (optID == (size_t)-1)
		return 0x80;	// bad device ID
	
	_devOpts[optID] = devOpts;
	
	size_t devID = _optDevMap[optID];
	if (devID < _devices.size())
	{
		DEV_INFO* devInf = &_devices[devID].base.defInf;
		RefreshDevOptions(_devices[devID], _devOpts[optID]);
		RefreshMuting(_devices[devID], _devOpts[optID].muteOpts);
		RefreshPanning(_devices[devID], _devOpts[optID].panOpts);
	}
	return 0x00;
}